

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_inverse_scalar(secp256k1_scalar *out,secp256k1_scalar *x,int var)

{
  int iVar1;
  code *pcVar2;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  secp256k1_scalar t;
  secp256k1_scalar r;
  secp256k1_scalar l;
  undefined1 local_58 [8];
  secp256k1_scalar *in_stack_ffffffffffffffb0;
  secp256k1_scalar *in_stack_ffffffffffffffb8;
  secp256k1_scalar *in_stack_ffffffffffffffc0;
  secp256k1_scalar *in_stack_ffffffffffffffc8;
  secp256k1_scalar *in_stack_ffffffffffffffd0;
  undefined8 local_28;
  undefined8 local_20;
  
  pcVar2 = secp256k1_scalar_inverse;
  if (in_EDX != 0) {
    pcVar2 = secp256k1_scalar_inverse_var;
  }
  (*pcVar2)(&stack0xffffffffffffffc8,in_RSI);
  if (in_RDI != (undefined8 *)0x0) {
    *in_RDI = in_stack_ffffffffffffffc8;
    in_RDI[1] = in_stack_ffffffffffffffd0;
    in_RDI[2] = local_28;
    in_RDI[3] = local_20;
  }
  iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x132a71);
  if (iVar1 == 0) {
    secp256k1_scalar_mul
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    iVar1 = secp256k1_scalar_is_one((secp256k1_scalar *)0x132aea);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
              ,0xcd1,"test condition failed: secp256k1_scalar_is_one(&t)");
      abort();
    }
    secp256k1_scalar_add
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x132b53);
    if (iVar1 == 0) {
      pcVar2 = secp256k1_scalar_inverse;
      if (in_EDX != 0) {
        pcVar2 = secp256k1_scalar_inverse_var;
      }
      (*pcVar2)(local_58);
      secp256k1_scalar_add
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      pcVar2 = secp256k1_scalar_inverse;
      if (in_EDX != 0) {
        pcVar2 = secp256k1_scalar_inverse_var;
      }
      (*pcVar2)(&stack0xffffffffffffffc8);
      secp256k1_scalar_add
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      secp256k1_scalar_add
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x132be7);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                ,0xcd9,"test condition failed: secp256k1_scalar_is_zero(&l)");
        abort();
      }
    }
  }
  else {
    iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x132a82);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
              ,0xccd,"test condition failed: secp256k1_scalar_is_zero(&l)");
      abort();
    }
  }
  return;
}

Assistant:

static void test_inverse_scalar(secp256k1_scalar* out, const secp256k1_scalar* x, int var)
{
    secp256k1_scalar l, r, t;

    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&l, x);  /* l = 1/x */
    if (out) *out = l;
    if (secp256k1_scalar_is_zero(x)) {
        CHECK(secp256k1_scalar_is_zero(&l));
        return;
    }
    secp256k1_scalar_mul(&t, x, &l);                                             /* t = x*(1/x) */
    CHECK(secp256k1_scalar_is_one(&t));                                          /* x*(1/x) == 1 */
    secp256k1_scalar_add(&r, x, &scalar_minus_one);                              /* r = x-1 */
    if (secp256k1_scalar_is_zero(&r)) return;
    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&r, &r); /* r = 1/(x-1) */
    secp256k1_scalar_add(&l, &scalar_minus_one, &l);                             /* l = 1/x-1 */
    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&l, &l); /* l = 1/(1/x-1) */
    secp256k1_scalar_add(&l, &l, &secp256k1_scalar_one);                         /* l = 1/(1/x-1)+1 */
    secp256k1_scalar_add(&l, &r, &l);                                            /* l = 1/(1/x-1)+1 + 1/(x-1) */
    CHECK(secp256k1_scalar_is_zero(&l));                                         /* l == 0 */
}